

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

int __thiscall QHttpNetworkConnectionChannel::close(QHttpNetworkConnectionChannel *this,int __fd)

{
  SocketState in_EAX;
  int iVar1;
  
  if (*(int *)(this + 0x20) != 0x10) {
    if (*(QIODevice **)(this + 0x10) == (QIODevice *)0x0) {
      *(undefined4 *)(this + 0x20) = 0;
      this[0x58] = (QHttpNetworkConnectionChannel)0x0;
    }
    else {
      in_EAX = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
      *(uint *)(this + 0x20) = (uint)(in_EAX != UnconnectedState) << 4;
      this[0x58] = (QHttpNetworkConnectionChannel)0x0;
      if (*(long **)(this + 0x10) != (long *)0x0) {
        iVar1 = (**(code **)(**(long **)(this + 0x10) + 0x70))();
        return iVar1;
      }
    }
  }
  return in_EAX;
}

Assistant:

void QHttpNetworkConnectionChannel::close()
{
    if (state == QHttpNetworkConnectionChannel::ClosingState)
        return;

    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        socket->close();
    }
}